

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_image_filters.cpp
# Opt level: O0

void __thiscall agg::image_filter_lut::realloc_lut(image_filter_lut *this,double radius)

{
  int iVar1;
  uint uVar2;
  uint size;
  double radius_local;
  image_filter_lut *this_local;
  
  *(double *)this = radius;
  uVar2 = uceil(radius);
  *(uint *)(this + 8) = uVar2 << 1;
  *(uint *)(this + 0xc) = -((*(uint *)(this + 8) >> 1) - 1);
  iVar1 = *(int *)(this + 8);
  uVar2 = pod_array<short>::size((pod_array<short> *)(this + 0x10));
  if (uVar2 < (uint)(iVar1 << 8)) {
    pod_array<short>::resize((pod_array<short> *)(this + 0x10),iVar1 << 8);
  }
  return;
}

Assistant:

void image_filter_lut::realloc_lut(double radius)
    {
        m_radius = radius;
        m_diameter = uceil(radius) * 2;
        m_start = -int(m_diameter / 2 - 1);
        unsigned size = m_diameter << image_subpixel_shift;
        if(size > m_weight_array.size())
        {
            m_weight_array.resize(size);
        }
    }